

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_refs_refs_up(lddmc_refs_internal_t lddmc_refs_key,MDD res)

{
  long lVar1;
  MDD *pMVar2;
  long size;
  MDD res_local;
  lddmc_refs_internal_t lddmc_refs_key_local;
  
  lVar1 = (long)lddmc_refs_key->rend - (long)lddmc_refs_key->rbegin >> 3;
  pMVar2 = (MDD *)realloc(lddmc_refs_key->rbegin,lVar1 << 4);
  lddmc_refs_key->rbegin = pMVar2;
  lddmc_refs_key->rcur = lddmc_refs_key->rbegin + lVar1;
  lddmc_refs_key->rend = lddmc_refs_key->rbegin + lVar1 * 2;
  return res;
}

Assistant:

MDD __attribute__((noinline))
lddmc_refs_refs_up(lddmc_refs_internal_t lddmc_refs_key, MDD res)
{
    long size = lddmc_refs_key->rend - lddmc_refs_key->rbegin;
    lddmc_refs_key->rbegin = (MDD*)realloc(lddmc_refs_key->rbegin, sizeof(MDD) * size * 2);
    lddmc_refs_key->rcur = lddmc_refs_key->rbegin + size;
    lddmc_refs_key->rend = lddmc_refs_key->rbegin + (size * 2);
    return res;
}